

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_diag.c
# Opt level: O1

int CVDiagGetNumRhsEvals(void *cvode_mem,long *nfevalsLS)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar1 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0xd9;
  }
  else {
    if (*(long *)((long)cvode_mem + 0x7e0) != 0) {
      *nfevalsLS = *(long *)(*(long *)((long)cvode_mem + 0x7e0) + 0x20);
      return 0;
    }
    msgfmt = "CVDIAG memory is NULL.";
    iVar1 = -2;
    error_code = -2;
    line = 0xe1;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVDiagGetNumRhsEvals",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVDiagGetNumRhsEvals(void* cvode_mem, long int* nfevalsLS)
{
  CVodeMem cv_mem;
  CVDiagMem cvdiag_mem;

  /* Return immediately if cvode_mem is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVDIAG_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_CVMEM_NULL);
    return (CVDIAG_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (lmem == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_LMEM_NULL);
    return (CVDIAG_LMEM_NULL);
  }
  cvdiag_mem = (CVDiagMem)lmem;

  *nfevalsLS = nfeDI;

  return (CVDIAG_SUCCESS);
}